

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O1

pam_t * pam_create_from_file(char *inpath)

{
  int iVar1;
  FILE *__stream;
  pam_t *__ptr;
  char *pcVar2;
  size_t sVar3;
  uint8_t *__ptr_00;
  char *pcVar4;
  ulong __size;
  uint uVar5;
  pam_t *ppVar6;
  bool bVar7;
  char line [1024];
  char local_438 [4];
  short sStack_434;
  undefined1 uStack_432;
  undefined1 uStack_431;
  char local_430;
  
  __stream = fopen(inpath,"r");
  if (__stream == (FILE *)0x0) {
    printf("pam.c: couldn\'t open input file: %s\n",inpath);
    return (pam_t *)0x0;
  }
  __ptr = (pam_t *)calloc(1,0x20);
  __ptr->type = -1;
  __ptr->width = -1;
  __ptr->height = -1;
  __ptr->depth = -1;
  __ptr->maxval = -1;
  uVar5 = 0;
switchD_003fdf6a_caseD_0:
  pcVar2 = fgets(local_438,0x400,__stream);
  if (pcVar2 == (char *)0x0) {
    puts("pam.c: unexpected EOF");
    ppVar6 = (pam_t *)0x4;
  }
  else {
    uVar5 = uVar5 + 1;
    ppVar6 = (pam_t *)0x2;
    if (local_438[0] != '#') {
      sVar3 = strlen(local_438);
      if (sVar3 == 0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar4 = local_438;
        pcVar2 = (char *)0x0;
        do {
          pcVar4 = pcVar4 + 1;
          if ((pcVar4[-1] == ' ') &&
             (pcVar4[-1] = '\0', bVar7 = pcVar2 != (char *)0x0, pcVar2 = pcVar4, bVar7)) {
            printf("pam.c: More than two tokens, %s:%d\n",inpath,(ulong)uVar5);
          }
          if (pcVar4[-1] == '\n') {
            pcVar4[-1] = '\0';
          }
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      if (local_438[2] != '\0' || CONCAT11(local_438[1],local_438[0]) != 0x3750) {
        if (CONCAT13(uStack_432,CONCAT21(sStack_434,local_438[3])) == 0x524448 &&
            CONCAT13(local_438[3],CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0]))) ==
            0x48444e45) {
          ppVar6 = (pam_t *)0x3;
        }
        else if ((sStack_434 == 0x48 &&
                  CONCAT13(local_438[3],CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0])))
                  == 0x54444957) && (pcVar2 != (char *)0x0)) {
          iVar1 = atoi(pcVar2);
          __ptr->width = iVar1;
        }
        else if ((CONCAT13(uStack_432,CONCAT21(sStack_434,local_438[3])) == 0x544847 &&
                  CONCAT13(local_438[3],CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0])))
                  == 0x47494548) && (pcVar2 != (char *)0x0)) {
          iVar1 = atoi(pcVar2);
          __ptr->height = iVar1;
        }
        else if ((sStack_434 == 0x48 &&
                  CONCAT13(local_438[3],CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0])))
                  == 0x54504544) && (pcVar2 != (char *)0x0)) {
          iVar1 = atoi(pcVar2);
          __ptr->depth = iVar1;
        }
        else if ((CONCAT13(uStack_432,CONCAT21(sStack_434,local_438[3])) == 0x4c4156 &&
                  CONCAT13(local_438[3],CONCAT12(local_438[2],CONCAT11(local_438[1],local_438[0])))
                  == 0x5658414d) && (pcVar2 != (char *)0x0)) {
          iVar1 = atoi(pcVar2);
          __ptr->maxval = iVar1;
        }
        else if ((local_430 == '\0' &&
                  CONCAT17(uStack_431,
                           CONCAT16(uStack_432,
                                    CONCAT24(sStack_434,
                                             CONCAT13(local_438[3],
                                                      CONCAT12(local_438[2],
                                                               CONCAT11(local_438[1],local_438[0])))
                                            ))) == 0x455059544c505554) && (pcVar2 != (char *)0x0)) {
          iVar1 = strcmp(pcVar2,"GRAYSCALE_ALPHA");
          if (iVar1 == 0) {
            __ptr->type = 5000;
          }
          else {
            iVar1 = strcmp(pcVar2,"RGB_ALPHA");
            if (iVar1 == 0) {
              __ptr->type = 0x1389;
            }
            else {
              iVar1 = strcmp(pcVar2,"RGB");
              if (iVar1 == 0) {
                __ptr->type = 0x138a;
              }
              else {
                iVar1 = strcmp(pcVar2,"GRAYSCALE");
                if (iVar1 == 0) {
                  __ptr->type = 0x138b;
                }
                else {
                  printf("pam.c: unrecognized tupl type %s\n",pcVar2);
                }
              }
            }
          }
        }
        else {
          ppVar6 = (pam_t *)0x0;
          printf("pam.c: unrecognized attribute %s\n",local_438);
        }
      }
    }
  }
  switch(ppVar6) {
  case (pam_t *)0x0:
  case (pam_t *)0x2:
    goto switchD_003fdf6a_caseD_0;
  default:
    return ppVar6;
  case (pam_t *)0x3:
    pcVar2 = "pam.c: missing required metadata field";
    if ((((-1 < __ptr->width) && (-1 < __ptr->height)) && (-1 < __ptr->depth)) &&
       ((-1 < __ptr->maxval && (-1 < __ptr->type)))) {
      if (__ptr->maxval != 0xff) {
        __assert_fail("pam->maxval == 255",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pam.c"
                      ,0x8c,"pam_t *pam_create_from_file(const char *)");
      }
      uVar5 = __ptr->height * __ptr->width * __ptr->depth;
      __size = (ulong)uVar5;
      __ptr->datalen = uVar5;
      __ptr_00 = (uint8_t *)malloc(__size);
      __ptr->data = __ptr_00;
      sVar3 = fread(__ptr_00,1,__size,__stream);
      if (sVar3 == __size) {
        fclose(__stream);
        return __ptr;
      }
      pcVar2 = "pam.c: couldn\'t read body";
    }
    puts(pcVar2);
  case (pam_t *)0x4:
    free(__ptr);
    fclose(__stream);
    return (pam_t *)0x0;
  }
}

Assistant:

pam_t *pam_create_from_file(const char *inpath)
{
    FILE *infile = fopen(inpath, "r");
    if (infile == NULL) {
        printf("pam.c: couldn't open input file: %s\n", inpath);
        return NULL;
    }

    pam_t *pam = calloc(1, sizeof(pam_t));
    pam->width = -1;
    pam->height = -1;
    pam->depth = -1;
    pam->maxval = -1;
    pam->type = -1;

    int linenumber = 0;

    while (1) {
        char line[1024];
        if (!fgets(line, sizeof(line), infile)) {
            printf("pam.c: unexpected EOF\n");
            goto fail;
        }
        linenumber++;

        char *tok0 = line;
        char *tok1 = NULL;

        if (line[0] == '#') // comment
            continue;

        size_t linelen = strlen(line);
        for (int idx = 0; idx < linelen; idx++) {
            if (line[idx] == ' ') {
                line[idx] = 0;
                if (tok1) {
                    printf("pam.c: More than two tokens, %s:%d\n", inpath, linenumber);
                }

                tok1 = &line[idx+1];
            }
            if (line[idx] == '\n')
                line[idx] = 0;
        }

        if (!strcmp(tok0, "P7"))
            continue;

        if (!strcmp(tok0, "ENDHDR"))
            break;

        if (!strcmp(tok0, "WIDTH") && tok1) {
            pam->width = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "HEIGHT") && tok1) {
            pam->height = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "DEPTH") && tok1) {
            pam->depth = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "MAXVAL") && tok1) {
            pam->maxval = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "TUPLTYPE") && tok1) {
            if (!strcmp(tok1, "GRAYSCALE_ALPHA")) {
                pam->type = PAM_GRAYSCALE_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB_ALPHA")) {
                pam->type = PAM_RGB_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB")) {
                pam->type = PAM_RGB;
                continue;
            }

            if (!strcmp(tok1, "GRAYSCALE")) {
                pam->type = PAM_GRAYSCALE;
                continue;
            }

            printf("pam.c: unrecognized tupl type %s\n", tok1);
            continue;
        }

        printf("pam.c: unrecognized attribute %s\n", tok0);
    }

    if (pam->width < 0 || pam->height < 0 || pam->depth < 0 ||
        pam->maxval < 0 || pam->type < 0) {
        printf("pam.c: missing required metadata field\n");
        goto fail;
    }

    assert(pam->maxval == 255);

    pam->datalen = pam->width * pam->height * pam->depth;
    pam->data = malloc(pam->datalen);
    if (pam->datalen != fread(pam->data, 1, pam->datalen, infile)) {
        printf("pam.c: couldn't read body\n");
        goto fail;
    }

    fclose(infile);
    return pam;

  fail:
    free(pam);
    fclose(infile);
    return NULL;
}